

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.cpp
# Opt level: O1

void server::listmaps(int sender)

{
  uint uVar1;
  size_t sVar2;
  long lVar3;
  uint uVar4;
  int iVar5;
  char *pcVar6;
  bool bVar7;
  vector<char_*> files;
  vector<char> line;
  char local_59;
  vector<char_*> local_58;
  vector<char> local_48;
  int local_34;
  
  local_58.buf = (char **)0x0;
  local_58.alen = 0;
  local_58.ulen = 0;
  local_48.buf = (char *)0x0;
  local_48.alen = 0;
  local_48.ulen = 0;
  listfiles(mappath,"ogz",&local_58);
  quicksort<char*,bool(*)(char*const&,char*const&)>
            (local_58.buf,local_58.buf + local_58.ulen,compareless<char*>);
  pcVar6 = "server map files:";
  if (local_58.ulen == 0) {
    pcVar6 = "server has no map files";
  }
  sendf(sender,1,"ris",0x23,pcVar6);
  iVar5 = 0;
  local_34 = sender;
  while (iVar5 < local_58.ulen) {
    local_48._8_8_ = local_48._8_8_ & 0xffffffff;
    if (iVar5 < local_58.ulen) {
      uVar4 = 0;
      lVar3 = (long)iVar5;
      do {
        if (uVar4 != 0) {
          local_59 = ' ';
          vector<char>::add(&local_48,&local_59);
        }
        pcVar6 = local_58.buf[lVar3];
        sVar2 = strlen(pcVar6);
        vector<char>::put(&local_48,pcVar6,(int)sVar2);
        uVar1 = uVar4 + 1;
      } while ((lVar3 + 1 < (long)local_58.ulen) &&
              (bVar7 = uVar4 < 4, uVar4 = uVar1, lVar3 = lVar3 + 1, bVar7));
      iVar5 = iVar5 + uVar1;
      sender = local_34;
    }
    local_59 = '\0';
    vector<char>::add(&local_48,&local_59);
    sendf(sender,1,"ris",0x23,local_48.buf);
  }
  while (local_58.ulen != 0) {
    iVar5 = local_58.ulen + -1;
    lVar3 = (long)local_58.ulen;
    local_58.ulen = iVar5;
    if (local_58.buf[lVar3 + -1] != (char *)0x0) {
      operator_delete__(local_58.buf[lVar3 + -1]);
    }
  }
  local_48._8_8_ = local_48._8_8_ & 0xffffffff;
  if (local_48.buf != (char *)0x0) {
    operator_delete__(local_48.buf);
  }
  local_58.ulen = 0;
  if (local_58.buf != (char **)0x0) {
    operator_delete__(local_58.buf);
  }
  return;
}

Assistant:

void listmaps(int sender)
    {
        vector<char *> files;
        vector<char> line;
        listfiles(mappath, "ogz", files);
        files.sort();
        sendf(sender, 1, "ris", N_SERVMSG, files.length() ? "server map files:" : "server has no map files");
        for(int i = 0; i < files.length();)
        {
            line.setsize(0);
            for(int j = 0; i < files.length() && j < 5; i++, j++)
            {
                if(j) line.add(' ');
                line.put(files[i], strlen(files[i]));
            }
            line.add(0);
            sendf(sender, 1, "ris", N_SERVMSG, line.getbuf());
        }
        files.deletearrays();
    }